

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime.cpp
# Opt level: O0

void __thiscall Datetime_UTC_Test::TestBody(Datetime_UTC_Test *this)

{
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  Datetime_UTC_Test *local_10;
  Datetime_UTC_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"1111-11-11T00:11:01Z",&local_31);
  anon_unknown.dwarf_5be53::test_parsing(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"0014-00-00t03:21:91Z",&local_69);
  anon_unknown.dwarf_5be53::test_parsing(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"1971-11-11t00:11:01z",&local_91);
  anon_unknown.dwarf_5be53::test_parsing(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"1971-01-11t00:11:01Z",&local_b9);
  anon_unknown.dwarf_5be53::test_parsing(&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return;
}

Assistant:

TEST(Datetime, UTC) {
    test_parsing("1111-11-11T00:11:01Z");
    test_parsing("0014-00-00t03:21:91Z");
    test_parsing("1971-11-11t00:11:01z");
    test_parsing("1971-01-11t00:11:01Z");
}